

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::LayerNorm_x86_avx::forward_inplace(LayerNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int elempack;
  int iVar1;
  int elemcount;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  elempack = bottom_top_blob->elempack;
  iVar1 = bottom_top_blob->dims;
  elemcount = bottom_top_blob->w;
  if (iVar1 == 1) {
    layernorm((float *)bottom_top_blob->data,(float *)(this->super_LayerNorm).gamma_data.data,
              (float *)(this->super_LayerNorm).beta_data.data,(this->super_LayerNorm).eps,
              elemcount * elempack,1);
  }
  else {
    uVar2 = bottom_top_blob->h;
    uVar3 = bottom_top_blob->c;
    if (iVar1 == 3) {
      if ((this->super_LayerNorm).affine_size == elemcount) {
        if (0 < (int)uVar3) {
          uVar4 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar5 = 0;
              do {
                layernorm((float *)((long)bottom_top_blob->data +
                                   (long)bottom_top_blob->w * uVar5 * bottom_top_blob->elemsize +
                                   bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize),
                          (float *)(this->super_LayerNorm).gamma_data.data,
                          (float *)(this->super_LayerNorm).beta_data.data,
                          (this->super_LayerNorm).eps,elemcount,elempack);
                uVar5 = uVar5 + 1;
              } while (uVar2 != uVar5);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != uVar3);
        }
      }
      else if (0 < (int)uVar3) {
        uVar4 = 0;
        do {
          layernorm((float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data),
                    (float *)(this->super_LayerNorm).gamma_data.data,
                    (float *)(this->super_LayerNorm).beta_data.data,(this->super_LayerNorm).eps,
                    uVar2 * elemcount,elempack);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
    }
    else if ((iVar1 == 2) && (0 < (int)uVar2)) {
      uVar4 = 0;
      do {
        layernorm((float *)((long)bottom_top_blob->w * uVar4 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data),
                  (float *)(this->super_LayerNorm).gamma_data.data,
                  (float *)(this->super_LayerNorm).beta_data.data,(this->super_LayerNorm).eps,
                  elemcount,elempack);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int elempack = bottom_top_blob.elempack;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;

    if (dims == 1)
    {
        // assert affine_size == w

        float* ptr = bottom_top_blob;
        layernorm(ptr, gamma_data, beta_data, eps, w * elempack, 1);
    }

    if (dims == 2)
    {
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            layernorm(ptr, gamma_data, beta_data, eps, w, elempack);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    layernorm(ptr, gamma_data, beta_data, eps, w, elempack);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                layernorm(ptr, gamma_data, beta_data, eps, w * h, elempack);
            }
        }
    }

    return 0;
}